

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

uInt longest_match_fast(deflate_state *s,IPos cur_match)

{
  long lVar1;
  Bytef *pBVar2;
  Bytef *pBVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  pBVar3 = s->window;
  uVar9 = s->strstart;
  uVar11 = (ulong)cur_match;
  if ((pBVar3[uVar11] == pBVar3[uVar9]) &&
     (pBVar2 = pBVar3 + uVar9, pBVar3[uVar11 + 1] == pBVar2[1])) {
    lVar10 = 0;
    do {
      iVar8 = (int)pBVar2;
      iVar4 = (int)lVar10;
      if (pBVar2[lVar10 + 3] != pBVar3[lVar10 + uVar11 + 3]) {
        iVar8 = iVar8 + iVar4 + 3;
        goto LAB_005939d1;
      }
      if (pBVar2[lVar10 + 4] != pBVar3[lVar10 + uVar11 + 4]) {
        iVar8 = iVar8 + iVar4 + 4;
        goto LAB_005939d1;
      }
      if (pBVar2[lVar10 + 5] != pBVar3[lVar10 + uVar11 + 5]) {
        iVar8 = iVar8 + iVar4 + 5;
        goto LAB_005939d1;
      }
      if (pBVar2[lVar10 + 6] != pBVar3[lVar10 + uVar11 + 6]) {
        iVar8 = iVar8 + iVar4 + 6;
        goto LAB_005939d1;
      }
      if (pBVar2[lVar10 + 7] != pBVar3[lVar10 + uVar11 + 7]) {
        iVar8 = iVar8 + iVar4 + 7;
        goto LAB_005939d1;
      }
      if (pBVar2[lVar10 + 8] != pBVar3[lVar10 + uVar11 + 8]) {
        iVar8 = iVar8 + iVar4 + 8;
        goto LAB_005939d1;
      }
      if (pBVar2[lVar10 + 9] != pBVar3[lVar10 + uVar11 + 9]) {
        iVar8 = iVar8 + iVar4 + 9;
        goto LAB_005939d1;
      }
      lVar1 = lVar10 + 8;
    } while ((lVar10 + 2U < 0xfa) &&
            (lVar5 = lVar10 + uVar11 + 10, lVar6 = lVar10 + 10, lVar10 = lVar1,
            pBVar2[lVar6] == pBVar3[lVar5]));
    iVar8 = iVar8 + (int)lVar1 + 2;
LAB_005939d1:
    uVar9 = (iVar8 - (uVar9 + (int)pBVar3 + 0x102)) + 0x102;
    if (2 < (int)uVar9) {
      s->match_start = cur_match;
      uVar7 = s->lookahead;
      if (uVar9 < s->lookahead) {
        uVar7 = uVar9;
      }
      return uVar7;
    }
  }
  return 2;
}

Assistant:

local uInt longest_match_fast(s, cur_match)
    deflate_state *s;
    IPos cur_match;                             /* current match */
{
    register Bytef *scan = s->window + s->strstart; /* current string */
    register Bytef *match;                       /* matched string */
    register int len;                           /* length of current match */
    register Bytef *strend = s->window + s->strstart + MAX_MATCH;

    /* The code is optimized for HASH_BITS >= 8 and MAX_MATCH-2 multiple of 16.
     * It is easy to get rid of this optimization if necessary.
     */
    Assert(s->hash_bits >= 8 && MAX_MATCH == 258, "Code too clever");

    Assert((ulg)s->strstart <= s->window_size-MIN_LOOKAHEAD, "need lookahead");

    Assert(cur_match < s->strstart, "no future");

    match = s->window + cur_match;

    /* Return failure if the match length is less than 2:
     */
    if (match[0] != scan[0] || match[1] != scan[1]) return MIN_MATCH-1;

    /* The check at best_len-1 can be removed because it will be made
     * again later. (This heuristic is not always a win.)
     * It is not necessary to compare scan[2] and match[2] since they
     * are always equal when the other bytes match, given that
     * the hash keys are equal and that HASH_BITS >= 8.
     */
    scan += 2, match += 2;
    Assert(*scan == *match, "match[2]?");

    /* We check for insufficient lookahead only every 8th comparison;
     * the 256th check will be made at strstart+258.
     */
    do {
    } while (*++scan == *++match && *++scan == *++match &&
             *++scan == *++match && *++scan == *++match &&
             *++scan == *++match && *++scan == *++match &&
             *++scan == *++match && *++scan == *++match &&
             scan < strend);

    Assert(scan <= s->window+(unsigned)(s->window_size-1), "wild scan");

    len = MAX_MATCH - (int)(strend - scan);

    if (len < MIN_MATCH) return MIN_MATCH - 1;

    s->match_start = cur_match;
    return (uInt)len <= s->lookahead ? (uInt)len : s->lookahead;
}